

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::Execute(DrawTiltedSpanPalCommand *this,DrawerThread *thread)

{
  float fVar1;
  float fVar2;
  uint8_t *puVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  double dVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  iVar11 = *(int *)&(this->super_DrawerCommand).field_0xc;
  if (((thread->pass_start_y <= iVar11) && (iVar11 < thread->pass_end_y)) &&
     (iVar11 % thread->num_cores == thread->core)) {
    uVar14 = this->x2 - this->x1;
    fVar1 = (this->plane_sz).X;
    dVar24 = (double)((float)(this->x1 - centerx) * fVar1 +
                     (float)(centery - iVar11) * (this->plane_sz).Y + (this->plane_sz).Z);
    if (this->plane_shade == false) {
      if (0 < (int)uVar14) {
        uVar10 = 0;
        do {
          thread->tiltlighting[uVar10] = this->_colormap;
          uVar10 = uVar10 + 1;
        } while (uVar14 != uVar10);
      }
    }
    else {
      CalcTiltedLighting(this,(double)this->planelightfloat * dVar24,
                         ((double)(fVar1 * (float)(int)uVar14) + dVar24) *
                         (double)this->planelightfloat,uVar14,thread);
    }
    iVar11 = *(int *)&(this->super_DrawerCommand).field_0xc;
    fVar17 = (float)(centery - iVar11);
    fVar19 = (float)(this->x1 - centerx);
    lVar12 = (long)(int)(&ylookup)[iVar11] + (long)this->x1;
    fVar1 = (this->plane_su).X;
    fVar2 = (this->plane_sv).X;
    dVar16 = (double)(fVar1 * fVar19 + (this->plane_su).Y * fVar17 + (this->plane_su).Z);
    dVar18 = (double)(fVar19 * fVar2 + fVar17 * (this->plane_sv).Y + (this->plane_sv).Z);
    puVar3 = this->_destorg;
    bVar8 = (byte)this->_ybits;
    bVar5 = 0x20 - bVar8;
    bVar6 = (byte)this->_xbits;
    bVar9 = bVar5 - bVar6;
    uVar13 = ~(-1 << (bVar6 & 0x1f)) << (bVar8 & 0x1f);
    dVar21 = (1.0 / dVar24) * dVar16;
    dVar20 = (1.0 / dVar24) * dVar18;
    fVar17 = (this->plane_sz).X;
    this->x1 = 0;
    iVar11 = uVar14 + 1;
    if (0xe < (int)uVar14) {
      dVar23 = dVar20;
      dVar22 = dVar21;
      iVar7 = iVar11;
      do {
        dVar18 = dVar18 + (double)(fVar2 * 16.0);
        dVar16 = dVar16 + (double)(fVar1 * 16.0);
        dVar24 = dVar24 + (double)(fVar17 * 16.0);
        dVar21 = (1.0 / dVar24) * dVar16;
        dVar20 = (1.0 / dVar24) * dVar18;
        uVar14 = (int)(long)dVar22 + this->pviewx;
        uVar15 = (int)(long)dVar23 + this->pviewy;
        iVar11 = -0x10;
        do {
          puVar3[this->x1 + lVar12] =
               thread->tiltlighting[this->x1]
               [this->_source[uVar14 >> (bVar9 & 0x1f) & uVar13 | uVar15 >> (bVar5 & 0x1f)]];
          this->x1 = this->x1 + 1;
          uVar14 = uVar14 + (int)(long)((dVar21 - dVar22) * 0.0625);
          uVar15 = uVar15 + (int)(long)((dVar20 - dVar23) * 0.0625);
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        iVar11 = iVar7 + -0x10;
        bVar4 = 0x1f < iVar7;
        dVar23 = dVar20;
        dVar22 = dVar21;
        iVar7 = iVar11;
      } while (bVar4);
    }
    if (0 < iVar11) {
      if (iVar11 == 1) {
        puVar3[this->x1 + lVar12] =
             thread->tiltlighting[this->x1]
             [this->_source
              [(uint)(long)dVar21 >> (bVar9 & 0x1f) & uVar13 | (uint)(long)dVar20 >> (bVar5 & 0x1f)]
             ];
      }
      else {
        dVar23 = (double)iVar11;
        fVar1 = (this->plane_su).X;
        fVar2 = (this->plane_sv).X;
        dVar24 = 1.0 / ((double)(this->plane_sz).X * dVar23 + dVar24);
        uVar14 = (int)(long)dVar21 + this->pviewx;
        uVar15 = (int)(long)dVar20 + this->pviewy;
        do {
          puVar3[this->x1 + lVar12] =
               thread->tiltlighting[this->x1]
               [this->_source[uVar14 >> (bVar9 & 0x1f) & uVar13 | uVar15 >> (bVar5 & 0x1f)]];
          this->x1 = this->x1 + 1;
          uVar14 = uVar14 + (int)(long)((((double)fVar1 * dVar23 + dVar16) * dVar24 - dVar21) *
                                       (1.0 / dVar23));
          uVar15 = uVar15 + (int)(long)((dVar24 * ((double)fVar2 * dVar23 + dVar18) - dVar20) *
                                       (1.0 / dVar23));
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
    }
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(y))
			return;

		const uint8_t **tiltlighting = thread->tiltlighting;

		int width = x2 - x1;
		double iz, uz, vz;
		uint8_t *fb;
		uint32_t u, v;
		int i;

		iz = plane_sz[2] + plane_sz[1] * (centery - y) + plane_sz[0] * (x1 - centerx);

		// Lighting is simple. It's just linear interpolation from start to end
		if (plane_shade)
		{
			uz = (iz + plane_sz[0] * width) * planelightfloat;
			vz = iz * planelightfloat;
			CalcTiltedLighting(vz, uz, width, thread);
		}
		else
		{
			for (int i = 0; i < width; ++i)
			{
				tiltlighting[i] = _colormap;
			}
		}

		uz = plane_su[2] + plane_su[1] * (centery - y) + plane_su[0] * (x1 - centerx);
		vz = plane_sv[2] + plane_sv[1] * (centery - y) + plane_sv[0] * (x1 - centerx);

		fb = ylookup[y] + x1 + _destorg;

		uint8_t vshift = 32 - _ybits;
		uint8_t ushift = vshift - _xbits;
		int umask = ((1 << _xbits) - 1) << _ybits;

		#if 0
		// The "perfect" reference version of this routine. Pretty slow.
		// Use it only to see how things are supposed to look.
		i = 0;
		do
		{
			double z = 1.f / iz;

			u = int64_t(uz*z) + pviewx;
			v = int64_t(vz*z) + pviewy;
			R_SetDSColorMapLight(tiltlighting[i], 0, 0);
			fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
			iz += plane_sz[0];
			uz += plane_su[0];
			vz += plane_sv[0];
		} while (--width >= 0);
		#else
		//#define SPANSIZE 32
		//#define INVSPAN 0.03125f
		//#define SPANSIZE 8
		//#define INVSPAN 0.125f
		#define SPANSIZE 16
		#define INVSPAN	0.0625f

		double startz = 1.f / iz;
		double startu = uz*startz;
		double startv = vz*startz;
		double izstep, uzstep, vzstep;

		izstep = plane_sz[0] * SPANSIZE;
		uzstep = plane_su[0] * SPANSIZE;
		vzstep = plane_sv[0] * SPANSIZE;
		x1 = 0;
		width++;

		while (width >= SPANSIZE)
		{
			iz += izstep;
			uz += uzstep;
			vz += vzstep;

			double endz = 1.f / iz;
			double endu = uz*endz;
			double endv = vz*endz;
			uint32_t stepu = (uint32_t)int64_t((endu - startu) * INVSPAN);
			uint32_t stepv = (uint32_t)int64_t((endv - startv) * INVSPAN);
			u = (uint32_t)(int64_t(startu) + pviewx);
			v = (uint32_t)(int64_t(startv) + pviewy);

			for (i = SPANSIZE - 1; i >= 0; i--)
			{
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
			startu = endu;
			startv = endv;
			width -= SPANSIZE;
		}
		if (width > 0)
		{
			if (width == 1)
			{
				u = (uint32_t)int64_t(startu);
				v = (uint32_t)int64_t(startv);
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
			}
			else
			{
				double left = width;
				iz += plane_sz[0] * left;
				uz += plane_su[0] * left;
				vz += plane_sv[0] * left;

				double endz = 1.f / iz;
				double endu = uz*endz;
				double endv = vz*endz;
				left = 1.f / left;
				uint32_t stepu = (uint32_t)int64_t((endu - startu) * left);
				uint32_t stepv = (uint32_t)int64_t((endv - startv) * left);
				u = (uint32_t)(int64_t(startu) + pviewx);
				v = (uint32_t)(int64_t(startv) + pviewy);

				for (; width != 0; width--)
				{
					fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
					x1++;
					u += stepu;
					v += stepv;
				}
			}
		}
		#endif
	}